

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O2

int create_gear(gears_t_conflict1 *gears,int id,float inner,float outer,float width,int teeth,
               float tooth_depth)

{
  int iVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  GLenum GVar10;
  gear_conflict *pgVar11;
  Vertex *pafVar12;
  Strip *pSVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  char *__s;
  ulong uVar17;
  float *__sinx;
  float *pfVar18;
  long lVar19;
  float fVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float s [5];
  float c [5];
  double dStack_80;
  double dStack_70;
  double dStack_50;
  
  pgVar11 = (gear_conflict *)calloc(1,0x28);
  if (pgVar11 == (gear_conflict *)0x0) {
    puts("calloc gear failed");
    return -1;
  }
  gears->gear[(uint)id] = pgVar11;
  pafVar12 = (Vertex *)calloc((ulong)(uint)(teeth * 0x22),0x20);
  pgVar11->vertices = pafVar12;
  if (pafVar12 == (Vertex *)0x0) {
    __s = "calloc vertices failed";
  }
  else {
    pgVar11->nstrips = teeth * 7;
    pSVar13 = (Strip *)calloc((ulong)(uint)(teeth * 7),8);
    pgVar11->strips = pSVar13;
    if (pSVar13 != (Strip *)0x0) {
      fVar31 = outer + 0.35;
      fVar32 = outer + -0.35;
      dVar5 = (double)fVar31 * 0.36;
      dVar3 = (double)fVar32;
      fVar33 = width * 0.5;
      dVar7 = dVar3 * 0.36;
      dVar9 = (double)inner * 0.36;
      fVar29 = width * -0.5;
      uVar15 = 0;
      uVar17 = (ulong)(uint)teeth;
      if (teeth < 1) {
        uVar17 = uVar15;
      }
      auVar8._8_4_ = SUB84(dVar9,0);
      auVar8._0_8_ = dVar9;
      auVar8._12_4_ = (int)((ulong)dVar9 >> 0x20);
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = dVar3;
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      auVar6._8_4_ = SUB84(dVar7,0);
      auVar6._0_8_ = dVar7;
      auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = dVar5;
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      for (iVar16 = 0; iVar16 != (int)uVar17; iVar16 = iVar16 + 1) {
        pfVar18 = c;
        __sinx = s;
        for (lVar19 = 0; lVar19 != 5; lVar19 = lVar19 + 1) {
          sincosf((float)(int)lVar19 * (6.2831855 / (float)teeth) * 0.25 +
                  (float)iVar16 * (6.2831855 / (float)teeth),__sinx,pfVar18);
          pfVar18 = pfVar18 + 1;
          __sinx = __sinx + 1;
        }
        iVar1 = pgVar11->nvertices;
        lVar14 = (long)iVar1;
        pSVar13 = pgVar11->strips;
        pSVar13[uVar15].begin = iVar1;
        pafVar12 = pgVar11->vertices;
        pafVar12[lVar14][0] = fVar31 * c[1];
        pafVar12[lVar14][1] = s[1] * fVar31;
        pafVar12[lVar14][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14) + 0x10) = 0.0;
        pafVar12[lVar14][5] = 1.0;
        dStack_50 = auVar4._8_8_;
        auVar22._0_8_ = (double)s[1] * dVar5;
        auVar22._8_8_ = (double)c[1] * dStack_50;
        auVar22 = divpd(auVar22,auVar2);
        *(ulong *)(pafVar12[lVar14] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 1][0] = fVar31 * c[2];
        pafVar12[lVar14 + 1][1] = s[2] * fVar31;
        pafVar12[lVar14 + 1][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 1) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 1) + 0x10) = 0.0;
        pafVar12[lVar14 + 1][5] = 1.0;
        auVar23._0_8_ = (double)s[2] * dVar5;
        auVar23._8_8_ = (double)c[2] * dStack_50;
        auVar22 = divpd(auVar23,auVar2);
        *(ulong *)(pafVar12[lVar14 + 1] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 2][0] = fVar32 * c[0];
        pafVar12[lVar14 + 2][1] = s[0] * fVar32;
        pafVar12[lVar14 + 2][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 2) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 2) + 0x10) = 0.0;
        pafVar12[lVar14 + 2][5] = 1.0;
        dStack_70 = auVar6._8_8_;
        auVar24._0_8_ = (double)s[0] * dVar7;
        auVar24._8_8_ = (double)c[0] * dStack_70;
        auVar22 = divpd(auVar24,auVar2);
        *(ulong *)(pafVar12[lVar14 + 2] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 3][0] = fVar32 * c[3];
        pafVar12[lVar14 + 3][1] = s[3] * fVar32;
        pafVar12[lVar14 + 3][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 3) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 3) + 0x10) = 0.0;
        pafVar12[lVar14 + 3][5] = 1.0;
        auVar25._0_8_ = (double)s[3] * dVar7;
        auVar25._8_8_ = (double)c[3] * dStack_70;
        auVar22 = divpd(auVar25,auVar2);
        *(ulong *)(pafVar12[lVar14 + 3] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 4][0] = c[0] * inner;
        pafVar12[lVar14 + 4][1] = s[0] * inner;
        pafVar12[lVar14 + 4][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 4) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 4) + 0x10) = 0.0;
        pafVar12[lVar14 + 4][5] = 1.0;
        dStack_80 = auVar8._8_8_;
        auVar26._0_8_ = (double)s[0] * dVar9;
        auVar26._8_8_ = (double)c[0] * dStack_80;
        auVar22 = divpd(auVar26,auVar2);
        *(ulong *)(pafVar12[lVar14 + 4] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 5][0] = fVar32 * c[4];
        pafVar12[lVar14 + 5][1] = s[4] * fVar32;
        pafVar12[lVar14 + 5][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 5) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 5) + 0x10) = 0.0;
        pafVar12[lVar14 + 5][5] = 1.0;
        auVar27._0_8_ = (double)s[4] * dVar7;
        auVar27._8_8_ = (double)c[4] * dStack_70;
        auVar22 = divpd(auVar27,auVar2);
        *(ulong *)(pafVar12[lVar14 + 5] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pafVar12[lVar14 + 6][0] = c[4] * inner;
        pafVar12[lVar14 + 6][1] = s[4] * inner;
        pafVar12[lVar14 + 6][2] = fVar33;
        *(float *)((long)(pafVar12 + lVar14 + 6) + 0xc) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 6) + 0x10) = 0.0;
        lVar19 = lVar14 + 7;
        auVar28._0_8_ = (double)s[4] * dVar9;
        auVar28._8_8_ = (double)c[4] * dStack_80;
        auVar22 = divpd(auVar28,auVar2);
        pafVar12[lVar14 + 6][5] = 1.0;
        *(ulong *)(pafVar12[lVar14 + 6] + 6) =
             CONCAT44((float)(auVar22._8_8_ + 0.5),(float)(auVar22._0_8_ + 0.5));
        pSVar13[uVar15].count = 7;
        pSVar13[uVar15 + 1].begin = (int)lVar19;
        pafVar12[lVar19][0] = c[1] * fVar31;
        pafVar12[lVar19][1] = s[1] * fVar31;
        pafVar12[lVar19][2] = fVar29;
        pfVar18 = pafVar12[lVar19] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar19][7] = 0.0;
        pafVar12[lVar14 + 8][0] = c[2] * fVar31;
        pafVar12[lVar14 + 8][1] = s[2] * fVar31;
        pafVar12[lVar14 + 8][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 8] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 8][7] = 0.0;
        pafVar12[lVar14 + 9][0] = c[0] * fVar32;
        pafVar12[lVar14 + 9][1] = s[0] * fVar32;
        pafVar12[lVar14 + 9][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 9] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 9][7] = 0.0;
        pafVar12[lVar14 + 10][0] = c[3] * fVar32;
        pafVar12[lVar14 + 10][1] = s[3] * fVar32;
        pafVar12[lVar14 + 10][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 10] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 10][7] = 0.0;
        pafVar12 = pgVar11->vertices;
        pafVar12[lVar14 + 0xb][0] = c[0] * inner;
        pafVar12[lVar14 + 0xb][1] = s[0] * inner;
        pafVar12[lVar14 + 0xb][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0xb] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0xb][7] = 0.0;
        pafVar12[lVar14 + 0xc][0] = c[4] * fVar32;
        pafVar12[lVar14 + 0xc][1] = s[4] * fVar32;
        pafVar12[lVar14 + 0xc][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0xc] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0xc][7] = 0.0;
        pafVar12[lVar14 + 0xd][0] = c[4] * inner;
        pafVar12[lVar14 + 0xd][1] = s[4] * inner;
        pafVar12[lVar14 + 0xd][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0xd] + 3;
        pfVar18[0] = 0.0;
        pfVar18[1] = 0.0;
        pfVar18[2] = -1.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0xd][7] = 0.0;
        lVar19 = lVar14 + 0xe;
        pSVar13 = pgVar11->strips;
        pSVar13[uVar15 + 1].count = 7;
        pSVar13[uVar15 + 2].begin = (int)lVar19;
        pafVar12[lVar19][0] = fVar32 * c[0];
        pafVar12[lVar19][1] = s[0] * fVar32;
        pafVar12[lVar19][2] = fVar33;
        pafVar12[lVar19][7] = 0.0;
        uVar21 = CONCAT44(c[0] * fVar32 + -fVar31 * c[1],s[1] * fVar31 + -fVar32 * s[0]);
        pfVar18 = pafVar12[lVar19] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0xf][0] = c[0] * fVar32;
        pafVar12[lVar14 + 0xf][1] = s[0] * fVar32;
        pafVar12[lVar14 + 0xf][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0xf] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0xf][7] = 0.0;
        lVar19 = lVar14 + 0x12;
        pafVar12[lVar14 + 0x10][0] = c[1] * fVar31;
        pafVar12[lVar14 + 0x10][1] = s[1] * fVar31;
        pafVar12[lVar14 + 0x10][2] = fVar33;
        pfVar18 = pafVar12[lVar14 + 0x10] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x10][7] = 0.0;
        pafVar12[lVar14 + 0x11][0] = c[1] * fVar31;
        pafVar12[lVar14 + 0x11][1] = s[1] * fVar31;
        pafVar12[lVar14 + 0x11][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0x11] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x11][7] = 0.0;
        pSVar13[uVar15 + 2].count = 4;
        pSVar13[uVar15 + 3].begin = (int)lVar19;
        fVar20 = s[2] - s[1];
        fVar30 = c[1] - c[2];
        pafVar12[lVar19][0] = c[1] * fVar31;
        pafVar12[lVar19][1] = s[1] * fVar31;
        pafVar12[lVar19][2] = fVar33;
        pafVar12[lVar19][3] = fVar20;
        pafVar12[lVar19][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar19) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar19) + 0x18) = 0.0;
        pafVar12[lVar19][7] = 0.0;
        pafVar12[lVar14 + 0x13][0] = c[1] * fVar31;
        pafVar12[lVar14 + 0x13][1] = s[1] * fVar31;
        pafVar12[lVar14 + 0x13][2] = fVar29;
        pafVar12[lVar14 + 0x13][3] = fVar20;
        pafVar12[lVar14 + 0x13][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x13) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x13) + 0x18) = 0.0;
        lVar19 = lVar14 + 0x16;
        pafVar12[lVar14 + 0x13][7] = 0.0;
        pafVar12[lVar14 + 0x14][0] = c[2] * fVar31;
        pafVar12[lVar14 + 0x14][1] = s[2] * fVar31;
        pafVar12[lVar14 + 0x14][2] = fVar33;
        pafVar12[lVar14 + 0x14][3] = fVar20;
        pafVar12[lVar14 + 0x14][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x14) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x14) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x14][7] = 0.0;
        pafVar12[lVar14 + 0x15][0] = c[2] * fVar31;
        pafVar12[lVar14 + 0x15][1] = s[2] * fVar31;
        pafVar12[lVar14 + 0x15][2] = fVar29;
        pafVar12[lVar14 + 0x15][3] = fVar20;
        pafVar12[lVar14 + 0x15][4] = fVar30;
        pafVar12[lVar14 + 0x15][5] = 0.0;
        pafVar12 = pgVar11->vertices;
        *(float *)((long)(pafVar12 + lVar14 + 0x15) + 0x18) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x15) + 0x1c) = 0.0;
        pSVar13[uVar15 + 3].count = 4;
        pSVar13[uVar15 + 4].begin = (int)lVar19;
        pafVar12[lVar19][0] = fVar31 * c[2];
        pafVar12[lVar19][1] = s[2] * fVar31;
        pafVar12[lVar19][2] = fVar33;
        pafVar12[lVar19][7] = 0.0;
        uVar21 = CONCAT44(c[2] * fVar31 + c[3] * -fVar32,s[3] * fVar32 + s[2] * -fVar31);
        pfVar18 = pafVar12[lVar19] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x17][0] = c[2] * fVar31;
        pafVar12[lVar14 + 0x17][1] = s[2] * fVar31;
        pafVar12[lVar14 + 0x17][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0x17] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x17][7] = 0.0;
        pafVar12[lVar14 + 0x18][0] = c[3] * fVar32;
        pafVar12[lVar14 + 0x18][1] = s[3] * fVar32;
        pafVar12[lVar14 + 0x18][2] = fVar33;
        pfVar18 = pafVar12[lVar14 + 0x18] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x18][7] = 0.0;
        pafVar12[lVar14 + 0x19][0] = c[3] * fVar32;
        pafVar12[lVar14 + 0x19][1] = s[3] * fVar32;
        pafVar12[lVar14 + 0x19][2] = fVar29;
        pfVar18 = pafVar12[lVar14 + 0x19] + 3;
        *(undefined8 *)pfVar18 = uVar21;
        pfVar18[2] = 0.0;
        pfVar18[3] = 0.0;
        pafVar12[lVar14 + 0x19][7] = 0.0;
        lVar19 = lVar14 + 0x1a;
        pSVar13 = pgVar11->strips;
        pSVar13[uVar15 + 4].count = 4;
        pSVar13[uVar15 + 5].begin = (int)lVar19;
        fVar20 = s[4] - s[3];
        fVar30 = c[3] - c[4];
        pafVar12[lVar19][0] = c[3] * fVar32;
        pafVar12[lVar19][1] = s[3] * fVar32;
        pafVar12[lVar19][2] = fVar33;
        pafVar12[lVar19][3] = fVar20;
        pafVar12[lVar19][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar19) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar19) + 0x18) = 0.0;
        pafVar12[lVar19][7] = 0.0;
        pafVar12[lVar14 + 0x1b][0] = c[3] * fVar32;
        pafVar12[lVar14 + 0x1b][1] = s[3] * fVar32;
        pafVar12[lVar14 + 0x1b][2] = fVar29;
        pafVar12[lVar14 + 0x1b][3] = fVar20;
        pafVar12[lVar14 + 0x1b][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x1b) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x1b) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x1b][7] = 0.0;
        pafVar12[lVar14 + 0x1c][0] = c[4] * fVar32;
        pafVar12[lVar14 + 0x1c][1] = s[4] * fVar32;
        pafVar12[lVar14 + 0x1c][2] = fVar33;
        pafVar12[lVar14 + 0x1c][3] = fVar20;
        pafVar12[lVar14 + 0x1c][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x1c) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x1c) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x1c][7] = 0.0;
        pafVar12[lVar14 + 0x1d][0] = c[4] * fVar32;
        pafVar12[lVar14 + 0x1d][1] = s[4] * fVar32;
        pafVar12[lVar14 + 0x1d][2] = fVar29;
        pafVar12[lVar14 + 0x1d][3] = fVar20;
        pafVar12[lVar14 + 0x1d][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x1d) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x1d) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x1d][7] = 0.0;
        lVar19 = lVar14 + 0x1e;
        pSVar13[uVar15 + 5].count = 4;
        pSVar13[uVar15 + 6].begin = (int)lVar19;
        fVar20 = s[0] - s[4];
        fVar30 = c[4] - c[0];
        pafVar12[lVar19][0] = c[0] * inner;
        pafVar12[lVar19][1] = s[0] * inner;
        pafVar12[lVar19][2] = fVar33;
        pafVar12[lVar19][3] = fVar20;
        pafVar12[lVar19][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar19) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar19) + 0x18) = 0.0;
        pafVar12[lVar19][7] = 0.0;
        pafVar12[lVar14 + 0x1f][0] = c[0] * inner;
        pafVar12[lVar14 + 0x1f][1] = s[0] * inner;
        pafVar12[lVar14 + 0x1f][2] = fVar29;
        pafVar12[lVar14 + 0x1f][3] = fVar20;
        pafVar12[lVar14 + 0x1f][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x1f) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x1f) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x1f][7] = 0.0;
        pafVar12[lVar14 + 0x20][0] = c[4] * inner;
        pafVar12[lVar14 + 0x20][1] = s[4] * inner;
        pafVar12 = pgVar11->vertices;
        pafVar12[lVar14 + 0x20][2] = fVar33;
        pafVar12[lVar14 + 0x20][3] = fVar20;
        pafVar12[lVar14 + 0x20][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x20) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x20) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x20][7] = 0.0;
        pafVar12[lVar14 + 0x21][0] = c[4] * inner;
        pafVar12[lVar14 + 0x21][1] = s[4] * inner;
        pafVar12[lVar14 + 0x21][2] = fVar29;
        pafVar12[lVar14 + 0x21][3] = fVar20;
        pafVar12[lVar14 + 0x21][4] = fVar30;
        *(float *)((long)(pafVar12 + lVar14 + 0x21) + 0x14) = 0.0;
        *(float *)((long)(pafVar12 + lVar14 + 0x21) + 0x18) = 0.0;
        pafVar12[lVar14 + 0x21][7] = 0.0;
        pgVar11->nvertices = iVar1 + 0x22;
        pSVar13[uVar15 + 6].count = 4;
        uVar15 = uVar15 + 7;
      }
      (*gears->glGenBuffers)(1,&pgVar11->vbo);
      if (pgVar11->vbo == 0) {
        puts("glGenBuffers failed");
      }
      else {
        (*gears->glBindBuffer)(0x8892,pgVar11->vbo);
        GVar10 = (*gears->glGetError)();
        if (GVar10 == 0) {
          (*gears->glBufferData)(0x8892,(long)pgVar11->nvertices << 5,pgVar11->vertices,0x88e4);
          GVar10 = (*gears->glGetError)();
          if (GVar10 == 0) {
            return 0;
          }
          printf("glBufferData failed: 0x%x\n",(ulong)GVar10);
        }
        else {
          printf("glBindBuffer failed: 0x%x\n",(ulong)GVar10);
        }
      }
      goto LAB_0010bcb9;
    }
    __s = "calloc strips failed";
  }
  puts(__s);
LAB_0010bcb9:
  delete_gear(gears,id);
  return -1;
}

Assistant:

static int create_gear(gears_t *gears, int id, float inner, float outer, float width, int teeth, float tooth_depth)
{
  struct gear *gear;
  float r0, r1, r2, da, a1, ai, s[5], c[5];
  int i, j;
  GLenum err = GL_NO_ERROR;

  gear = calloc(1, sizeof(struct gear));
  if (!gear) {
    printf("calloc gear failed\n");
    return -1;
  }

  gears->gear[id] = gear;

  gear->list = glGenLists(1);
  if (!gear->list) {
    printf("glGenLists failed\n");
    goto out;
  }

  glNewList(gear->list, GL_COMPILE);
  err = glGetError();
  if (err) {
    printf("glNewList failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  r0 = inner;
  r1 = outer - tooth_depth / 2;
  r2 = outer + tooth_depth / 2;
  a1 = 2 * M_PI / teeth;
  da = a1 / 4;

  for (i = 0; i < teeth; i++) {
    ai = i * a1;
    for (j = 0; j < 5; j++) {
      sincosf(ai + j * da, &s[j], &c[j]);
    }

    /* front face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* front face normal */
    glNormal3f(0, 0, 1);
    /* front face vertices */
    glTexCoord2f(0.36 * r2 * s[1] / r1 + 0.5, 0.36 * r2 * c[1] / r1 + 0.5);
    glVertex3f(r2 * c[1], r2 * s[1], width / 2);
    glTexCoord2f(0.36 * r2 * s[2] / r1 + 0.5, 0.36 * r2 * c[2] / r1 + 0.5);
    glVertex3f(r2 * c[2], r2 * s[2], width / 2);
    glTexCoord2f(0.36 * r1 * s[0] / r1 + 0.5, 0.36 * r1 * c[0] / r1 + 0.5);
    glVertex3f(r1 * c[0], r1 * s[0], width / 2);
    glTexCoord2f(0.36 * r1 * s[3] / r1 + 0.5, 0.36 * r1 * c[3] / r1 + 0.5);
    glVertex3f(r1 * c[3], r1 * s[3], width / 2);
    glTexCoord2f(0.36 * r0 * s[0] / r1 + 0.5, 0.36 * r0 * c[0] / r1 + 0.5);
    glVertex3f(r0 * c[0], r0 * s[0], width / 2);
    glTexCoord2f(0.36 * r1 * s[4] / r1 + 0.5, 0.36 * r1 * c[4] / r1 + 0.5);
    glVertex3f(r1 * c[4], r1 * s[4], width / 2);
    glTexCoord2f(0.36 * r0 * s[4] / r1 + 0.5, 0.36 * r0 * c[4] / r1 + 0.5);
    glVertex3f(r0 * c[4], r0 * s[4], width / 2);
    glTexCoord2f(0, 0);
    /* front face end */
    glEnd();

    /* back face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* back face normal */
    glNormal3f(0, 0, -1);
    /* back face vertices */
    glVertex3f(r2 * c[1], r2 * s[1], -width / 2);
    glVertex3f(r2 * c[2], r2 * s[2], -width / 2);
    glVertex3f(r1 * c[0], r1 * s[0], -width / 2);
    glVertex3f(r1 * c[3], r1 * s[3], -width / 2);
    glVertex3f(r0 * c[0], r0 * s[0], -width / 2);
    glVertex3f(r1 * c[4], r1 * s[4], -width / 2);
    glVertex3f(r0 * c[4], r0 * s[4], -width / 2);
    /* back face end */
    glEnd();

    /* first outward face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* first outward face normal */
    glNormal3f(r2 * s[1] - r1 * s[0], r1 * c[0] - r2 * c[1], 0);
    /* first outward face vertices */
    glVertex3f(r1 * c[0], r1 * s[0],  width / 2);
    glVertex3f(r1 * c[0], r1 * s[0], -width / 2);
    glVertex3f(r2 * c[1], r2 * s[1],  width / 2);
    glVertex3f(r2 * c[1], r2 * s[1], -width / 2);
    /* first outward face end */
    glEnd();

    /* second outward face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* second outward face normal */
    glNormal3f(s[2] - s[1], c[1] - c[2], 0);
    /* second outward face vertices */
    glVertex3f(r2 * c[1], r2 * s[1],  width / 2);
    glVertex3f(r2 * c[1], r2 * s[1], -width / 2);
    glVertex3f(r2 * c[2], r2 * s[2],  width / 2);
    glVertex3f(r2 * c[2], r2 * s[2], -width / 2);
    /* second outward face end */
    glEnd();

    /* third outward face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* third outward face normal */
    glNormal3f(r1 * s[3] - r2 * s[2], r2 * c[2] - r1 * c[3], 0);
    /* third outward face vertices */
    glVertex3f(r2 * c[2], r2 * s[2],  width / 2);
    glVertex3f(r2 * c[2], r2 * s[2], -width / 2);
    glVertex3f(r1 * c[3], r1 * s[3],  width / 2);
    glVertex3f(r1 * c[3], r1 * s[3], -width / 2);
    /* third outward face end */
    glEnd();

    /* fourth outward face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* fourth outward face normal */
    glNormal3f(s[4] - s[3], c[3] - c[4], 0);
    /* fourth outward face vertices */
    glVertex3f(r1 * c[3], r1 * s[3],  width / 2);
    glVertex3f(r1 * c[3], r1 * s[3], -width / 2);
    glVertex3f(r1 * c[4], r1 * s[4],  width / 2);
    glVertex3f(r1 * c[4], r1 * s[4], -width / 2);
    /* fourth outward face end */
    glEnd();

    /* inside face begin */
    glBegin(GL_TRIANGLE_STRIP);
    /* inside face normal */
    glNormal3f(s[0] - s[4], c[4] - c[0], 0);
    /* inside face vertices */
    glVertex3f(r0 * c[0], r0 * s[0],  width / 2);
    glVertex3f(r0 * c[0], r0 * s[0], -width / 2);
    glVertex3f(r0 * c[4], r0 * s[4],  width / 2);
    glVertex3f(r0 * c[4], r0 * s[4], -width / 2);
    /* inside face end */
    glEnd();
  }

  glEndList();
  err = glGetError();
  if (err) {
    printf("glEndList failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  return 0;

out:
  delete_gear(gears, id);
  return -1;
}